

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O2

quint32 __thiscall
HPack::HuffmanDecoder::addTable(HuffmanDecoder *this,quint32 prefix,quint32 index)

{
  long in_FS_OFFSET;
  value_type local_34;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_34.offset =
       (quint32)(((long)(this->tableData).
                        super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->tableData).
                       super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  local_34.prefixLength = prefix;
  local_34.indexLength = index;
  std::vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>::push_back
            (&this->prefixTables,&local_34);
  std::vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>::resize
            (&this->tableData,
             (1L << ((byte)local_34.indexLength & 0x3f)) +
             ((long)(this->tableData).
                    super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->tableData).
                   super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)(((long)(this->prefixTables).
                        super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->prefixTables).
                       super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0xc) - 1;
  }
  __stack_chk_fail();
}

Assistant:

quint32 HuffmanDecoder::addTable(quint32 prefix, quint32 index)
{
    PrefixTable newTable{prefix, index};
    newTable.offset = quint32(tableData.size());
    prefixTables.push_back(newTable);
    // Add entries for this table:
    tableData.resize(tableData.size() + newTable.size());

    return quint32(prefixTables.size() - 1);
}